

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O2

void * tommy_hashdyn_remove_existing(tommy_hashdyn *hashdyn,tommy_hashdyn_node *node)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_list_remove_existing(hashdyn->bucket + (hashdyn->bucket_mask & node->key),node);
  hashdyn->count = hashdyn->count - 1;
  hashdyn_shrink_step(hashdyn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashdyn_remove_existing(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node)
{
	tommy_count_t pos = node->key & hashdyn->bucket_mask;

	tommy_list_remove_existing(&hashdyn->bucket[pos], node);

	--hashdyn->count;

	hashdyn_shrink_step(hashdyn);

	return node->data;
}